

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::deleteVertexArray(ReferenceContext *this,VertexArray *vertexArray)

{
  pointer pVVar1;
  pointer pVVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->m_vertexArrayBinding == vertexArray) {
    (*(this->super_Context)._vptr_Context[0x4b])(this,0);
  }
  if (vertexArray->m_elementArrayBufferBinding != (DataBuffer *)0x0) {
    rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
              (&this->m_buffers,vertexArray->m_elementArrayBufferBinding);
  }
  pVVar1 = (vertexArray->m_arrays).
           super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (vertexArray->m_arrays).
           super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar2 != pVVar1) {
    lVar3 = 0x20;
    uVar4 = 0;
    do {
      if (*(DataBuffer **)(&pVVar1->enabled + lVar3) != (DataBuffer *)0x0) {
        rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
                  (&this->m_buffers,*(DataBuffer **)(&pVVar1->enabled + lVar3));
        pVVar1 = (vertexArray->m_arrays).
                 super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar2 = (vertexArray->m_arrays).
                 super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x30;
    } while (uVar4 < (ulong)(((long)pVVar2 - (long)pVVar1 >> 4) * -0x5555555555555555));
  }
  rc::ObjectManager<sglr::rc::VertexArray>::releaseReference(&this->m_vertexArrays,vertexArray);
  return;
}

Assistant:

void ReferenceContext::deleteVertexArray (rc::VertexArray* vertexArray)
{
	if (m_vertexArrayBinding == vertexArray)
		bindVertexArray(0);

	if (vertexArray->m_elementArrayBufferBinding)
		m_buffers.releaseReference(vertexArray->m_elementArrayBufferBinding);

	for (size_t ndx = 0; ndx < vertexArray->m_arrays.size(); ++ndx)
		if (vertexArray->m_arrays[ndx].bufferBinding)
			m_buffers.releaseReference(vertexArray->m_arrays[ndx].bufferBinding);

	DE_ASSERT(vertexArray->getRefCount() == 1);
	m_vertexArrays.releaseReference(vertexArray);
}